

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineInputAssemblyTests.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::anon_unknown_0::PrimitiveRestartTest::createBufferData
          (PrimitiveRestartTest *this,VkPrimitiveTopology topology,int primitiveCount,
          VkIndexType indexType,vector<unsigned_int,_std::allocator<unsigned_int>_> *indexData,
          vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
          *vertexData)

{
  bool bVar1;
  int iVar2;
  int vertexNdx_1;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  int vertexNdx;
  float fVar6;
  uint local_134;
  float local_130;
  float local_12c;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> vertices;
  value_type local_108;
  undefined1 local_e8 [28];
  float local_cc;
  PrimitiveRestartTest *local_c8;
  float local_bc;
  Vector<float,_4> local_b8;
  uint local_9c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  value_type local_68;
  Vector<float,_4> local_48;
  
  local_b8.m_data[0] = 1.0;
  local_b8.m_data[1] = 0.0;
  local_b8.m_data[2] = 0.0;
  local_b8.m_data[3] = 1.0;
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 1.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 1.0;
  local_68.position.m_data[0] = -1.0;
  local_68.position.m_data[1] = -1.0;
  local_68.position.m_data[2] = 0.0;
  local_68.position.m_data[3] = 1.0;
  local_c8 = this;
  tcu::Vector<float,_4>::Vector(&local_68.color,&local_48);
  indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8._0_16_ = ZEXT816(0);
  switch(topology - VK_PRIMITIVE_TOPOLOGY_LINE_STRIP) {
  case VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
    iVar2 = primitiveCount / 2;
    break;
  default:
    goto switchD_00505582_caseD_1;
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
    iVar2 = primitiveCount / -2 + primitiveCount;
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
    local_e8._0_12_ = ZEXT812(0x3f4ccccd);
    local_e8._12_4_ = 0;
    local_cc = 0.8;
    goto LAB_00505775;
  }
  local_e8._0_16_ = ZEXT416((uint)(1.6 / (float)iVar2));
switchD_00505582_caseD_1:
  switch(topology - VK_PRIMITIVE_TOPOLOGY_LINE_STRIP) {
  case VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
    uVar4 = 0;
    local_130 = (float)(-(uint)(indexType != VK_INDEX_TYPE_UINT16) | 0xffff);
    if (primitiveCount < 1) {
      primitiveCount = 0;
    }
    bVar5 = true;
    while (uVar3 = (uint)uVar4, uVar3 != primitiveCount) {
      bVar1 = isRestartPrimitive(local_c8,uVar3);
      if (bVar1) {
        local_108.position.m_data[0] = local_130;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,(uint *)&local_108);
      }
      else {
        if (bVar5 != false) {
          local_108.position.m_data[1] = (float)(uVar3 & 1) * 1.6 + -0.8;
          local_108.position.m_data[0] = (float)(int)(uVar4 >> 1) * (float)local_e8._0_4_ + -0.8;
          local_108.position.m_data[2] = 0.0;
          local_108.position.m_data[3] = 1.0;
          tcu::Vector<float,_4>::Vector(&local_108.color,&local_b8);
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&vertices,&local_108);
          local_134 = (int)((ulong)((long)vertices.
                                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)vertices.
                                         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (&indices,&local_134);
        }
        local_108.position.m_data[1] = (float)(uVar3 + 1 & 1) * 1.6 + -0.8;
        local_108.position.m_data[0] = (float)(uVar3 + 1 >> 1) * (float)local_e8._0_4_ + -0.8;
        local_108.position.m_data[2] = 0.0;
        local_108.position.m_data[3] = 1.0;
        tcu::Vector<float,_4>::Vector(&local_108.color,&local_b8);
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back(&vertices,&local_108);
        local_134 = (int)((ulong)((long)vertices.
                                        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)vertices.
                                       super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,&local_134);
      }
      bVar5 = bVar1;
      uVar4 = (ulong)(uVar3 + 1);
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
    fVar6 = 0.0;
    local_12c = (float)(-(uint)(indexType != VK_INDEX_TYPE_UINT16) | 0xffff);
    if (primitiveCount < 1) {
      primitiveCount = 0;
    }
    local_e8._4_4_ = 0x3fcccccd;
    local_e8._8_8_ = 0;
    local_130 = (float)primitiveCount;
    bVar5 = true;
    for (; fVar6 != local_130; fVar6 = (float)((int)fVar6 + 1)) {
      bVar1 = isRestartPrimitive(local_c8,(int)fVar6);
      if (bVar1) {
        local_108.position.m_data[0] = local_12c;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,(uint *)&local_108);
      }
      else {
        if (bVar5 != false) {
          for (iVar2 = 0; iVar2 != 2; iVar2 = iVar2 + 1) {
            local_108.position.m_data[0] =
                 (float)(((int)fVar6 + iVar2) / 2) * (float)local_e8._0_4_ + -0.8;
            local_108.position.m_data[1] =
                 (float)(((int)fVar6 + iVar2) % 2) * (float)local_e8._4_4_ + -0.8;
            local_108.position.m_data[2] = 0.0;
            local_108.position.m_data[3] = 1.0;
            tcu::Vector<float,_4>::Vector(&local_108.color,&local_b8);
            std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
            push_back(&vertices,&local_108);
            local_134 = (int)((ulong)((long)vertices.
                                            super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)vertices.
                                           super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (&indices,&local_134);
          }
        }
        local_108.position.m_data._0_8_ =
             CONCAT44((float)((int)((int)fVar6 + 2U) % 2) * (float)local_e8._4_4_ + -0.8,
                      (float)((int)((int)fVar6 + 2U) / 2) * (float)local_e8._0_4_ + -0.8);
        local_108.position.m_data[2] = 0.0;
        local_108.position.m_data[3] = 1.0;
        tcu::Vector<float,_4>::Vector(&local_108.color,&local_b8);
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back(&vertices,&local_108);
        local_134 = (int)((ulong)((long)vertices.
                                        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)vertices.
                                       super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,&local_134);
      }
      bVar5 = bVar1;
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
    local_cc = 1.6;
LAB_00505775:
    local_bc = 1.5707964;
    if (6.2831855 / (float)primitiveCount <= 1.5707964) {
      local_bc = 6.2831855 / (float)primitiveCount;
    }
    iVar2 = 0;
    local_9c = -(uint)(indexType != VK_INDEX_TYPE_UINT16) | 0xffff;
    if (primitiveCount < 1) {
      primitiveCount = 0;
    }
    bVar5 = true;
    for (; iVar2 != primitiveCount; iVar2 = iVar2 + 1) {
      bVar1 = isRestartPrimitive(local_c8,iVar2);
      if (bVar1) {
        local_108.position.m_data[0] = (float)local_9c;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,(uint *)&local_108);
      }
      else {
        if (bVar5 != false) {
          local_108.position.m_data[0] = 0.0;
          local_108.position.m_data[1] = 0.0;
          local_108.position.m_data[2] = 0.0;
          local_108.position.m_data[3] = 1.0;
          tcu::Vector<float,_4>::Vector(&local_108.color,&local_b8);
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&vertices,&local_108);
          local_134 = (int)((ulong)((long)vertices.
                                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)vertices.
                                         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (&indices,&local_134);
          local_12c = (float)iVar2 * local_bc;
          local_130 = cosf(local_12c);
          fVar6 = sinf(local_12c);
          local_108.position.m_data[1] = fVar6 * local_cc;
          local_108.position.m_data[0] = local_130 * (float)local_e8._0_4_;
          local_108.position.m_data[2] = 0.0;
          local_108.position.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&vertices,&local_108);
          local_134 = (int)((ulong)((long)vertices.
                                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)vertices.
                                         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (&indices,&local_134);
        }
        local_12c = (float)(iVar2 + 1) * local_bc;
        local_130 = cosf(local_12c);
        fVar6 = sinf(local_12c);
        local_108.position.m_data[1] = fVar6 * local_cc;
        local_108.position.m_data[0] = local_130 * (float)local_e8._0_4_;
        local_108.position.m_data[2] = 0.0;
        local_108.position.m_data[3] = 1.0;
        tcu::Vector<float,_4>::Vector(&local_108.color,&local_b8);
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back(&vertices,&local_108);
        local_134 = (int)((ulong)((long)vertices.
                                        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)vertices.
                                       super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,&local_134);
      }
      bVar5 = bVar1;
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (&vertices,&local_68);
    uVar4 = 0;
    local_130 = (float)(-(uint)(indexType != VK_INDEX_TYPE_UINT16) | 0xffff);
    if (primitiveCount < 1) {
      primitiveCount = 0;
    }
    bVar5 = true;
    while (uVar3 = (uint)uVar4, uVar3 != primitiveCount) {
      bVar1 = isRestartPrimitive(local_c8,uVar3);
      if (bVar1) {
        local_108.position.m_data._0_8_ = (ulong)(uint)local_108.position.m_data[1] << 0x20;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,(uint *)&local_108);
        local_108.position.m_data[0] = local_130;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,(uint *)&local_108);
      }
      else {
        if (bVar5 != false) {
          local_108.position.m_data._0_8_ = (ulong)(uint)local_108.position.m_data[1] << 0x20;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (&indices,(uint *)&local_108);
          local_108.position.m_data[1] = (float)(uVar3 & 1) * 1.6 + -0.8;
          local_108.position.m_data[0] = (float)(int)(uVar4 >> 1) * (float)local_e8._0_4_ + -0.8;
          local_108.position.m_data[2] = 0.0;
          local_108.position.m_data[3] = 1.0;
          tcu::Vector<float,_4>::Vector(&local_108.color,&local_b8);
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&vertices,&local_108);
          local_134 = (int)((ulong)((long)vertices.
                                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)vertices.
                                         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (&indices,&local_134);
        }
        local_108.position.m_data[1] = (float)(uVar3 + 1 & 1) * 1.6 + -0.8;
        local_108.position.m_data[0] = (float)(uVar3 + 1 >> 1) * (float)local_e8._0_4_ + -0.8;
        local_108.position.m_data[2] = 0.0;
        local_108.position.m_data[3] = 1.0;
        tcu::Vector<float,_4>::Vector(&local_108.color,&local_b8);
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back(&vertices,&local_108);
        local_134 = (int)((ulong)((long)vertices.
                                        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)vertices.
                                       super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,&local_134);
      }
      bVar5 = bVar1;
      uVar4 = (ulong)(uVar3 + 1);
    }
    local_108.position.m_data._0_8_ = local_108.position.m_data._0_8_ & 0xffffffff00000000;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&indices,(uint *)&local_108);
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (&vertices,&local_68);
    fVar6 = 0.0;
    local_12c = (float)(-(uint)(indexType != VK_INDEX_TYPE_UINT16) | 0xffff);
    if (primitiveCount < 1) {
      primitiveCount = 0;
    }
    local_e8._4_4_ = 0x3fcccccd;
    local_e8._8_8_ = 0;
    local_130 = (float)primitiveCount;
    bVar5 = true;
    for (; fVar6 != local_130; fVar6 = (float)((int)fVar6 + 1)) {
      bVar1 = isRestartPrimitive(local_c8,(int)fVar6);
      if (bVar1) {
        local_108.position.m_data[0] = local_12c;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,(uint *)&local_108);
      }
      else {
        if (bVar5 != false) {
          for (iVar2 = 0; iVar2 != 2; iVar2 = iVar2 + 1) {
            local_108.position.m_data[0] =
                 (float)(((int)fVar6 + iVar2) / 2) * (float)local_e8._0_4_ + -0.8;
            local_108.position.m_data[1] =
                 (float)(((int)fVar6 + iVar2) % 2) * (float)local_e8._4_4_ + -0.8;
            local_108.position.m_data[2] = 0.0;
            local_108.position.m_data[3] = 1.0;
            tcu::Vector<float,_4>::Vector(&local_108.color,&local_b8);
            std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
            push_back(&vertices,&local_108);
            local_134 = (int)((ulong)((long)vertices.
                                            super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)vertices.
                                           super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (&indices,&local_134);
            local_134 = 0;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (&indices,&local_134);
          }
        }
        local_108.position.m_data._0_8_ =
             CONCAT44((float)((int)((int)fVar6 + 2U) % 2) * (float)local_e8._4_4_ + -0.8,
                      (float)((int)((int)fVar6 + 2U) / 2) * (float)local_e8._0_4_ + -0.8);
        local_108.position.m_data[2] = 0.0;
        local_108.position.m_data[3] = 1.0;
        tcu::Vector<float,_4>::Vector(&local_108.color,&local_b8);
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back(&vertices,&local_108);
        local_134 = (int)((ulong)((long)vertices.
                                        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)vertices.
                                       super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,&local_134);
        local_134 = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,&local_134);
      }
      bVar5 = bVar1;
    }
  }
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::operator=
            (vertexData,&vertices);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(indexData,&indices);
  std::_Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
  ~_Vector_base(&vertices.
                 super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
               );
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void PrimitiveRestartTest::createBufferData (VkPrimitiveTopology topology, int primitiveCount, VkIndexType indexType, std::vector<deUint32>& indexData, std::vector<Vertex4RGBA>& vertexData) const
{
	DE_ASSERT(primitiveCount > 0);
	DE_UNREF(indexType);

	const tcu::Vec4				red						(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4				green					(0.0f, 1.0f, 0.0f, 1.0f);
	const float					border					= 0.2f;
	const float					originX					= -1.0f + border;
	const float					originY					= -1.0f + border;
	const Vertex4RGBA			defaultVertex			= { tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f), green };
	float						primitiveSizeY			= (2.0f - 2.0f * border);
	float						primitiveSizeX;
	bool						primitiveStart			= true;
	std::vector<deUint32>		indices;
	std::vector<Vertex4RGBA>	vertices;


	// Calculate primitive size
	switch (topology)
	{
		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
			primitiveSizeX = (2.0f - 2.0f * border) / float(primitiveCount / 2);
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
			primitiveSizeX = (2.0f - 2.0f * border) / float(primitiveCount / 2 + primitiveCount % 2);
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
			primitiveSizeX = 1.0f - border;
			primitiveSizeY = 1.0f - border;
			break;

		default:
			primitiveSizeX = 0.0f; // Garbage
			DE_ASSERT(false);
	}

	switch (topology)
	{
		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (isRestartPrimitive(primitiveNdx))
				{
					indices.push_back(InputAssemblyTest::getRestartIndex(indexType));
					primitiveStart = true;
				}
				else
				{
					if (primitiveStart)
					{
						const Vertex4RGBA vertex =
						{
							tcu::Vec4(originX + float(primitiveNdx / 2) * primitiveSizeX, originY + float(primitiveNdx % 2) * primitiveSizeY, 0.0f, 1.0f),
							red
						};

						vertices.push_back(vertex);
						indices.push_back((deUint32)vertices.size() - 1);

						primitiveStart = false;
					}

					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 1) / 2) * primitiveSizeX, originY + float((primitiveNdx + 1) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back((deUint32)vertices.size() - 1);
				}
			}
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
		{
			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (isRestartPrimitive(primitiveNdx))
				{
					indices.push_back(InputAssemblyTest::getRestartIndex(indexType));
					primitiveStart = true;
				}
				else
				{
					if (primitiveStart)
					{
						for (int vertexNdx = 0; vertexNdx < 2; vertexNdx++)
						{
							const Vertex4RGBA vertex =
							{
								tcu::Vec4(originX + float((primitiveNdx + vertexNdx) / 2) * primitiveSizeX, originY + float((primitiveNdx + vertexNdx) % 2) * primitiveSizeY, 0.0f, 1.0f),
								red
							};

							vertices.push_back(vertex);
							indices.push_back((deUint32)vertices.size() - 1);
						}

						primitiveStart = false;
					}
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 2) / 2) * primitiveSizeX, originY + float((primitiveNdx + 2) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back((deUint32)vertices.size() - 1);
				}
			}
			break;
		}

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
		{
			const float stepAngle = de::min(DE_PI * 0.5f, (2 * DE_PI) / float(primitiveCount));

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (isRestartPrimitive(primitiveNdx))
				{
					indices.push_back(InputAssemblyTest::getRestartIndex(indexType));
					primitiveStart = true;
				}
				else
				{
					if (primitiveStart)
					{
						Vertex4RGBA vertex =
						{
							tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f),
							red
						};

						vertices.push_back(vertex);
						indices.push_back((deUint32)vertices.size() - 1);

						vertex.position = tcu::Vec4(primitiveSizeX * deFloatCos(stepAngle * float(primitiveNdx)), primitiveSizeY * deFloatSin(stepAngle * float(primitiveNdx)), 0.0f, 1.0f),
						vertices.push_back(vertex);
						indices.push_back((deUint32)vertices.size() - 1);

						primitiveStart = false;
					}

					const Vertex4RGBA vertex =
					{
						tcu::Vec4(primitiveSizeX * deFloatCos(stepAngle * float(primitiveNdx + 1)), primitiveSizeY * deFloatSin(stepAngle * float(primitiveNdx + 1)), 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back((deUint32)vertices.size() - 1);
				}
			}
			break;
		}

		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
			vertices.push_back(defaultVertex);

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (isRestartPrimitive(primitiveNdx))
				{
					indices.push_back(0);
					indices.push_back(InputAssemblyTest::getRestartIndex(indexType));
					primitiveStart = true;
				}
				else
				{
					if (primitiveStart)
					{
						indices.push_back(0);

						const Vertex4RGBA vertex =
						{
							tcu::Vec4(originX + float(primitiveNdx / 2) * primitiveSizeX, originY + float(primitiveNdx % 2) * primitiveSizeY, 0.0f, 1.0f),
							red
						};

						vertices.push_back(vertex);
						indices.push_back((deUint32)vertices.size() - 1);

						primitiveStart = false;
					}

					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 1) / 2) * primitiveSizeX, originY + float((primitiveNdx + 1) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back((deUint32)vertices.size() - 1);
				}
			}

			indices.push_back(0);
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
			vertices.push_back(defaultVertex);

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (isRestartPrimitive(primitiveNdx))
				{
					indices.push_back(InputAssemblyTest::getRestartIndex(indexType));
					primitiveStart = true;
				}
				else
				{
					if (primitiveStart)
					{
						for (int vertexNdx = 0; vertexNdx < 2; vertexNdx++)
						{
							const Vertex4RGBA vertex =
							{
								tcu::Vec4(originX + float((primitiveNdx + vertexNdx) / 2) * primitiveSizeX, originY + float((primitiveNdx + vertexNdx) % 2) * primitiveSizeY, 0.0f, 1.0f),
								red
							};

							vertices.push_back(vertex);
							indices.push_back((deUint32)vertices.size() - 1);
							indices.push_back(0);
						}

						primitiveStart = false;
					}

					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 2) / 2) * primitiveSizeX, originY + float((primitiveNdx + 2) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back((deUint32)vertices.size() - 1);
					indices.push_back(0);
				}
			}
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	vertexData	= vertices;
	indexData	= indices;
}